

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::FtraceDescriptor::FtraceDescriptor
          (FtraceDescriptor *this,FtraceDescriptor *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__FtraceDescriptor_003c6e48;
  (this->atrace_categories_).
  super__Vector_base<perfetto::protos::gen::FtraceDescriptor_AtraceCategory,_std::allocator<perfetto::protos::gen::FtraceDescriptor_AtraceCategory>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_2->atrace_categories_).
       super__Vector_base<perfetto::protos::gen::FtraceDescriptor_AtraceCategory,_std::allocator<perfetto::protos::gen::FtraceDescriptor_AtraceCategory>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->atrace_categories_).
  super__Vector_base<perfetto::protos::gen::FtraceDescriptor_AtraceCategory,_std::allocator<perfetto::protos::gen::FtraceDescriptor_AtraceCategory>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (param_2->atrace_categories_).
       super__Vector_base<perfetto::protos::gen::FtraceDescriptor_AtraceCategory,_std::allocator<perfetto::protos::gen::FtraceDescriptor_AtraceCategory>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->atrace_categories_).
  super__Vector_base<perfetto::protos::gen::FtraceDescriptor_AtraceCategory,_std::allocator<perfetto::protos::gen::FtraceDescriptor_AtraceCategory>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_2->atrace_categories_).
       super__Vector_base<perfetto::protos::gen::FtraceDescriptor_AtraceCategory,_std::allocator<perfetto::protos::gen::FtraceDescriptor_AtraceCategory>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_2->atrace_categories_).
  super__Vector_base<perfetto::protos::gen::FtraceDescriptor_AtraceCategory,_std::allocator<perfetto::protos::gen::FtraceDescriptor_AtraceCategory>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->atrace_categories_).
  super__Vector_base<perfetto::protos::gen::FtraceDescriptor_AtraceCategory,_std::allocator<perfetto::protos::gen::FtraceDescriptor_AtraceCategory>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_2->atrace_categories_).
  super__Vector_base<perfetto::protos::gen::FtraceDescriptor_AtraceCategory,_std::allocator<perfetto::protos::gen::FtraceDescriptor_AtraceCategory>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_2->unknown_fields_)._M_dataplus._M_p;
  paVar2 = &(param_2->unknown_fields_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(param_2->unknown_fields_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->unknown_fields_).field_2 + 8) = uVar4;
  }
  else {
    (this->unknown_fields_)._M_dataplus._M_p = pcVar3;
    (this->unknown_fields_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->unknown_fields_)._M_string_length = (param_2->unknown_fields_)._M_string_length;
  (param_2->unknown_fields_)._M_dataplus._M_p = (pointer)paVar2;
  (param_2->unknown_fields_)._M_string_length = 0;
  (param_2->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_2->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

FtraceDescriptor::FtraceDescriptor(FtraceDescriptor&&) noexcept = default;